

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t * uriParsePctEncodedW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                             UriMemoryManager *memory)

{
  wchar_t wVar1;
  UriMemoryManager *memory_local;
  wchar_t *afterLast_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  if (first < afterLast) {
    if (first + 1 < afterLast) {
      wVar1 = first[1];
      if ((((uint)(wVar1 + L'\xffffffd0') < 10) || ((uint)(wVar1 + L'\xffffffbf') < 6)) ||
         ((uint)(wVar1 + L'\xffffff9f') < 6)) {
        if (first + 2 < afterLast) {
          wVar1 = first[2];
          if ((((uint)(wVar1 + L'\xffffffd0') < 10) || ((uint)(wVar1 + L'\xffffffbf') < 6)) ||
             ((uint)(wVar1 + L'\xffffff9f') < 6)) {
            state_local = (UriParserStateW *)(first + 3);
          }
          else {
            uriStopSyntaxW(state,first + 2,memory);
            state_local = (UriParserStateW *)0x0;
          }
        }
        else {
          uriStopSyntaxW(state,afterLast,memory);
          state_local = (UriParserStateW *)0x0;
        }
      }
      else {
        uriStopSyntaxW(state,first + 1,memory);
        state_local = (UriParserStateW *)0x0;
      }
    }
    else {
      uriStopSyntaxW(state,afterLast,memory);
      state_local = (UriParserStateW *)0x0;
    }
  }
  else {
    uriStopSyntaxW(state,afterLast,memory);
    state_local = (UriParserStateW *)0x0;
  }
  return (wchar_t *)state_local;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePctEncoded)(
		URI_TYPE(ParserState) * state,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriMemoryManager * memory) {
	if (first >= afterLast) {
		URI_FUNC(StopSyntax)(state, afterLast, memory);
		return NULL;
	}

	/*
	First character has already been
	checked before entering this rule.

	switch (*first) {
	case _UT('%'):
	*/
		if (first + 1 >= afterLast) {
			URI_FUNC(StopSyntax)(state, afterLast, memory);
			return NULL;
		}

		switch (first[1]) {
		case URI_SET_HEXDIG:
			if (first + 2 >= afterLast) {
				URI_FUNC(StopSyntax)(state, afterLast, memory);
				return NULL;
			}

			switch (first[2]) {
			case URI_SET_HEXDIG:
				return first + 3;

			default:
				URI_FUNC(StopSyntax)(state, first + 2, memory);
				return NULL;
			}

		default:
			URI_FUNC(StopSyntax)(state, first + 1, memory);
			return NULL;
		}

	/*
	default:
		URI_FUNC(StopSyntax)(state, first, memory);
		return NULL;
	}
	*/
}